

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_blend_popcnt(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 (*pauVar6) [32];
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar7 [16];
  int j;
  int i_1;
  __m256i input1;
  __m256i input0;
  __m256i v1;
  __m256i v0;
  size_t i;
  uint32_t n_cycles;
  __m256i *data_vectors;
  undefined4 local_408;
  undefined4 local_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined8 local_378;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_150;
  undefined8 uStack_148;
  
  for (local_378 = 0; local_378 + 2 <= (ulong)(in_ESI >> 4); local_378 = local_378 + 2) {
    pauVar6 = (undefined1 (*) [32])(in_RDI + local_378 * 0x20);
    pauVar1 = (undefined1 (*) [32])(in_RDI + 0x20 + local_378 * 0x20);
    auVar2 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar2 = vpinsrw_avx(auVar2,0xff,2);
    auVar2 = vpinsrw_avx(auVar2,0xff,3);
    auVar2 = vpinsrw_avx(auVar2,0xff,4);
    auVar2 = vpinsrw_avx(auVar2,0xff,5);
    auVar2 = vpinsrw_avx(auVar2,0xff,6);
    auVar2 = vpinsrw_avx(auVar2,0xff,7);
    auVar3 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar3 = vpinsrw_avx(auVar3,0xff,2);
    auVar3 = vpinsrw_avx(auVar3,0xff,3);
    auVar3 = vpinsrw_avx(auVar3,0xff,4);
    auVar3 = vpinsrw_avx(auVar3,0xff,5);
    auVar3 = vpinsrw_avx(auVar3,0xff,6);
    auVar3 = vpinsrw_avx(auVar3,0xff,7);
    uStack_190 = auVar3._0_8_;
    uStack_188 = auVar3._8_8_;
    auVar5._16_8_ = uStack_190;
    auVar5._0_16_ = auVar2;
    auVar5._24_8_ = uStack_188;
    auVar4 = vpand_avx2(*pauVar6,auVar5);
    auVar5 = vpsllw_avx2(*pauVar1,ZEXT416(8));
    local_3e0 = vpor_avx2(auVar4,auVar5);
    auVar2 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar2 = vpinsrw_avx(auVar2,0xff00,2);
    auVar2 = vpinsrw_avx(auVar2,0xff00,3);
    auVar2 = vpinsrw_avx(auVar2,0xff00,4);
    auVar2 = vpinsrw_avx(auVar2,0xff00,5);
    auVar2 = vpinsrw_avx(auVar2,0xff00,6);
    auVar2 = vpinsrw_avx(auVar2,0xff00,7);
    auVar3 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar3 = vpinsrw_avx(auVar3,0xff00,2);
    auVar3 = vpinsrw_avx(auVar3,0xff00,3);
    auVar3 = vpinsrw_avx(auVar3,0xff00,4);
    auVar3 = vpinsrw_avx(auVar3,0xff00,5);
    auVar3 = vpinsrw_avx(auVar3,0xff00,6);
    auVar3 = vpinsrw_avx(auVar3,0xff00,7);
    auVar7 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    uStack_150 = auVar7._0_8_;
    uStack_148 = auVar7._8_8_;
    auVar4._16_8_ = uStack_150;
    auVar4._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar4._24_8_ = uStack_148;
    auVar4 = vpand_avx2(*pauVar6,auVar4);
    auVar5 = vpsrlw_avx2(*pauVar1,ZEXT416(8));
    local_400 = vpor_avx2(auVar4,auVar5);
    for (local_404 = 0; local_404 < 8; local_404 = local_404 + 1) {
      *(int *)(in_RDX + (long)(7 - local_404) * 4) =
           POPCOUNT((uint)(SUB321(local_3e0 >> 7,0) & 1) |
                    (uint)(SUB321(local_3e0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_3e0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_3e0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_3e0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_3e0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_3e0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_3e0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_3e0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_3e0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_3e0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_3e0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_3e0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_3e0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_3e0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_3e0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_3e0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_3e0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_3e0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_3e0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_3e0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_3e0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_3e0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_3e0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_3e0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_3e0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_3e0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_3e0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_3e0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_3e0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_3e0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_3e0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_404) * 4);
      *(int *)(in_RDX + (long)(0xf - local_404) * 4) =
           POPCOUNT((uint)(SUB321(local_400 >> 7,0) & 1) |
                    (uint)(SUB321(local_400 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_400 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_400 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_400 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_400 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_400 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_400 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_400 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_400 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_400 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_400 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_400 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_400 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_400 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_400 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_400 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_400 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_400 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_400 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_400 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_400 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_400 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_400 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_400 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_400 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_400 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_400 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_400 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_400 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_400 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_400[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_404) * 4);
      local_3e0 = vpaddb_avx2(local_3e0,local_3e0);
      local_400 = vpaddb_avx2(local_400,local_400);
    }
  }
  for (local_378 = local_378 << 4; local_378 < in_ESI; local_378 = local_378 + 1) {
    for (local_408 = 0; local_408 < 0x10; local_408 = local_408 + 1) {
      *(int *)(in_RDX + (long)local_408 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_378 * 2) & 1 << ((byte)local_408 & 0x1f)) >>
           ((byte)local_408 & 0x1f)) + *(int *)(in_RDX + (long)local_408 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m256i v0 = _mm256_loadu_si256(data_vectors + i + 0);
        __m256i v1 = _mm256_loadu_si256(data_vectors + i + 1);
        __m256i input0 = _mm256_or_si256(_mm256_and_si256(v0, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v1, 8));
        __m256i input1 = _mm256_or_si256(_mm256_and_si256(v0, _mm256_set1_epi16((int16_t)0xFF00)), _mm256_srli_epi16(v1, 8));
        
        for (int i = 0; i < 8; ++i) {
            flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input0));
            flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input1));
            input0 = _mm256_add_epi8(input0, input0);
            input1 = _mm256_add_epi8(input1, input1);
        }
    }

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }
   
    return 0;
}